

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNB::DataSave(OPNB *this,OPNBData *data,void *adpcmadata)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Channel4 *this_00;
  long lVar4;
  
  OPNABase::DataSave(&this->super_OPNABase,&data->opnabase);
  data->adpcmasize = this->adpcmasize;
  memcpy(data->adpcma,this->adpcma,0xd8);
  data->adpcmatl = this->adpcmatl;
  data->adpcmatvol = this->adpcmatvol;
  data->adpcmakey = this->adpcmakey;
  data->adpcmastep = this->adpcmastep;
  uVar1 = *(undefined8 *)this->adpcmareg;
  uVar2 = *(undefined8 *)(this->adpcmareg + 8);
  uVar3 = *(undefined8 *)(this->adpcmareg + 0x18);
  *(undefined8 *)(data->adpcmareg + 0x10) = *(undefined8 *)(this->adpcmareg + 0x10);
  *(undefined8 *)(data->adpcmareg + 0x18) = uVar3;
  *(undefined8 *)data->adpcmareg = uVar1;
  *(undefined8 *)(data->adpcmareg + 8) = uVar2;
  this_00 = (Channel4 *)&this->field_0x14d8;
  lVar4 = 0;
  do {
    Channel4::DataSave(this_00,(Channel4Data *)((long)data->ch[0].buf + lVar4 + -4));
    lVar4 = lVar4 + 0x238;
    this_00 = this_00 + 1;
  } while (lVar4 != 0xd50);
  return;
}

Assistant:

void OPNB::DataSave(struct OPNBData* data, void* adpcmadata) {
	OPNABase::DataSave(&data->opnabase);
	if(adpcmasize) {
		adpcmadata = malloc(adpcmasize);
		memcpy(adpcmadata, adpcmabuf, adpcmasize);
	}
	data->adpcmasize = adpcmasize;
	memcpy(data->adpcma, adpcma, sizeof(ADPCMA) * 6);
	data->adpcmatl = adpcmatl;
	data->adpcmatvol = adpcmatvol;
	data->adpcmakey = adpcmakey;
	data->adpcmastep = adpcmastep;
	memcpy(data->adpcmareg, adpcmareg, 32);
	for(int i = 0; i < 6; i++) {
		ch[i].DataSave(&data->ch[i]);
	}
}